

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::NodeIterator::
NodeIterator(NodeIterator *this,self_type *index)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  iterator *piVar1;
  AlexNode<int,_int> **__args;
  int iVar2;
  AlexNode<int,_int> *pAVar3;
  _Elt_pointer ppAVar4;
  double dVar5;
  AlexNode<int,_int> *pAVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  model_node_type *node;
  
  this->index_ = index;
  this->cur_node_ = index->root_node_;
  this_00 = &this->node_stack_;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
  _M_initialize_map((_Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                     *)this_00,0);
  pAVar3 = this->cur_node_;
  if ((pAVar3 != (AlexNode<int,_int> *)0x0) && (pAVar3->is_leaf_ == false)) {
    iVar2._0_1_ = pAVar3[1].is_leaf_;
    iVar2._1_1_ = pAVar3[1].duplication_factor_;
    iVar2._2_2_ = pAVar3[1].level_;
    __args = (AlexNode<int,_int> **)((long)pAVar3[1].model_.a_ + -8 + (long)iVar2 * 8);
    ppAVar4 = (this->node_stack_).c.
              super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar4 ==
        (this->node_stack_).c.
        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
      _M_push_back_aux<alex::AlexNode<int,int>*const&>
                ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)this_00
                 ,__args);
    }
    else {
      *ppAVar4 = *__args;
      piVar1 = &(this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if (1 < *(int *)&pAVar3[1].is_leaf_) {
      uVar8 = (ulong)(*(int *)&pAVar3[1].is_leaf_ - 2);
      lVar9 = uVar8 << 3;
      lVar10 = uVar8 + 1;
      do {
        dVar5 = pAVar3[1].model_.a_;
        pAVar6 = *(AlexNode<int,_int> **)((long)dVar5 + -8 + lVar10 * 8);
        if (pAVar6 != *(AlexNode<int,_int> **)((long)dVar5 + lVar10 * 8)) {
          ppAVar4 = (this->node_stack_).c.
                    super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppAVar4 ==
              (this->node_stack_).c.
              super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
            _M_push_back_aux<alex::AlexNode<int,int>*const&>
                      ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                       this_00,(AlexNode<int,_int> **)((long)dVar5 + lVar9));
          }
          else {
            *ppAVar4 = pAVar6;
            piVar1 = &(this->node_stack_).c.
                      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        lVar9 = lVar9 + -8;
        lVar11 = lVar10 + -1;
        bVar7 = 0 < lVar10;
        lVar10 = lVar11;
      } while (lVar11 != 0 && bVar7);
    }
  }
  return;
}

Assistant:

explicit NodeIterator(const self_type* index)
        : index_(index), cur_node_(index->root_node_) {
      if (cur_node_ && !cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }
    }